

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

void __thiscall mocker::ir::FunctionModule::sortBasicBlocks(FunctionModule *this)

{
  BasicBlockList *pBVar1;
  size_t sVar2;
  bool bVar3;
  _List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *p_Var4;
  long lVar5;
  _List_node_base *p_Var6;
  undefined1 *puVar7;
  long lVar8;
  size_t *psVar9;
  _List_node_base *p_Var10;
  _List_node_base *p_Var11;
  long lVar12;
  list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> *plVar13;
  bool bVar14;
  list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> __carry;
  _List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> local_650;
  undefined1 local_638 [16];
  list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> local_628 [8];
  list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> local_620 [1520];
  
  pBVar1 = &this->bbs;
  p_Var10 = (this->bbs).
            super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  if ((p_Var10 != (_List_node_base *)pBVar1) && (p_Var10->_M_next != (_List_node_base *)pBVar1)) {
    local_650._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_650;
    local_650._M_impl._M_node._M_size = 0;
    lVar5 = 0;
    do {
      puVar7 = local_638 + lVar5;
      *(undefined1 **)(local_620 + lVar5 + -0x10) = puVar7;
      *(undefined1 **)puVar7 = puVar7;
      *(undefined8 *)(local_620 + lVar5 + -8) = 0;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x600);
    lVar5 = 0;
    local_650._M_impl._M_node.super__List_node_base._M_prev =
         local_650._M_impl._M_node.super__List_node_base._M_next;
    do {
      lVar8 = lVar5;
      if (p_Var10->_M_next != local_650._M_impl._M_node.super__List_node_base._M_next &&
          local_650._M_impl._M_node.super__List_node_base._M_next != p_Var10) {
        std::__detail::_List_node_base::_M_transfer
                  (local_650._M_impl._M_node.super__List_node_base._M_next,p_Var10);
        local_650._M_impl._M_node._M_size =
             (size_t)((long)(_List_node_base **)local_650._M_impl._M_node._M_size + 1);
        psVar9 = &(this->bbs).
                  super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
                  _M_impl._M_node._M_size;
        *psVar9 = *psVar9 - 1;
      }
      p_Var6 = (_List_node_base *)(local_638 + lVar8);
      lVar5 = 0x18;
      if (lVar8 == 0) {
        bVar3 = true;
        p_Var10 = (_List_node_base *)local_638;
      }
      else {
        p_Var11 = (_List_node_base *)local_638;
        lVar12 = lVar8;
        do {
          bVar14 = p_Var11 == p_Var11->_M_next;
          bVar3 = !bVar14;
          if (bVar14) {
            lVar5 = 0;
            p_Var10 = p_Var11;
            break;
          }
          std::__cxx11::list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>>::
          merge<mocker::ir::FunctionModule::sortBasicBlocks()::__0>
                    ((list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> *)p_Var11,
                     (_List_node_base *)&local_650);
          std::__detail::_List_node_base::swap((_List_node_base *)&local_650,p_Var11);
          p_Var10 = p_Var11[1]._M_next;
          p_Var11[1]._M_next = (_List_node_base *)local_650._M_impl._M_node._M_size;
          local_650._M_impl._M_node._M_size = (size_t)p_Var10;
          p_Var11 = (_List_node_base *)&p_Var11[1]._M_prev;
          lVar12 = lVar12 + -0x18;
          p_Var10 = p_Var6;
        } while (lVar12 != 0);
      }
      std::__detail::_List_node_base::swap((_List_node_base *)&local_650,p_Var10);
      p_Var11 = p_Var10[1]._M_next;
      p_Var10[1]._M_next = (_List_node_base *)local_650._M_impl._M_node._M_size;
      local_650._M_impl._M_node._M_size = (size_t)p_Var11;
      lVar5 = lVar5 + lVar8;
      p_Var10 = (pBVar1->
                super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>).
                _M_impl._M_node.super__List_node_base._M_next;
    } while (p_Var10 != (_List_node_base *)pBVar1);
    if (lVar5 != 0x18) {
      plVar13 = local_620;
      do {
        std::__cxx11::list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>>::
        merge<mocker::ir::FunctionModule::sortBasicBlocks()::__0>(plVar13,plVar13 + -0x18);
        plVar13 = plVar13 + 0x18;
      } while (plVar13 !=
               (list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> *)
               (local_638 + lVar5));
    }
    p_Var4 = (_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
             local_638;
    if (!bVar3) {
      p_Var6 = (_List_node_base *)
               ((long)&local_650._M_impl._M_node.super__List_node_base._M_next + lVar8);
      p_Var4 = &local_650;
    }
    psVar9 = (size_t *)((long)&(p_Var4->_M_impl)._M_node._M_size + lVar8);
    std::__detail::_List_node_base::swap((_List_node_base *)pBVar1,p_Var6);
    sVar2 = *psVar9;
    *psVar9 = (this->bbs).
              super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
              _M_impl._M_node._M_size;
    (this->bbs).super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
    _M_impl._M_node._M_size = sVar2;
    lVar5 = 0x5e8;
    do {
      std::__cxx11::_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
      _M_clear((_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
               (local_638 + lVar5));
      lVar5 = lVar5 + -0x18;
    } while (lVar5 != -0x18);
    std::__cxx11::_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
    _M_clear(&local_650);
  }
  return;
}

Assistant:

void FunctionModule::sortBasicBlocks() {
  bbs.sort([](const BasicBlock &lhs, const BasicBlock &rhs) {
    return lhs.getLabelID() < rhs.getLabelID();
  });
}